

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPController.cpp
# Opt level: O3

void __thiscall cppti::HTTPController::routeTalks(HTTPController *this,Request *req,Response *res)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  TalksDB *this_00;
  span<const_std::basic_string_view<char,_std::char_traits<char>_>,__1L> filtertags;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__nptr;
  size_t sVar3;
  size_t sVar4;
  Response *pRVar5;
  const_iterator cVar6;
  char *pcVar7;
  ostream *poVar8;
  int *piVar9;
  undefined8 uVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  reference_wrapper<const_cppti::TalksDB::TalkRef> *prVar12;
  Params *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  long lVar14;
  char *pcVar15;
  _Base_ptr p_Var16;
  string_view speaker_00;
  string_view conference_00;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  tags;
  string raw_tags;
  string rawyear;
  string conference;
  string speaker;
  key_type local_158;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_138;
  reference_wrapper<const_cppti::TalksDB::TalkRef> *local_118;
  long local_110;
  reference_wrapper<const_cppti::TalksDB::TalkRef> local_108 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f8;
  ulong local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  undefined1 local_d8 [8];
  json_value local_d0;
  char *local_c8;
  size_t local_c0;
  char local_b8;
  undefined7 uStack_b7;
  char *local_a8;
  size_t local_a0;
  char local_98;
  undefined7 uStack_97;
  vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>
  local_88;
  Params *local_70;
  _Base_ptr local_68;
  HTTPController *local_60;
  Response *local_58;
  __normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>
  local_50;
  extent_type<_1L> local_48;
  pointer peStack_40;
  char *local_38;
  
  this_01 = &req->params;
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  local_58 = res;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"speaker","");
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_01->_M_t,&local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  p_Var16 = &(req->params)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_a8 = &local_98;
  if (cVar6._M_node == p_Var16) {
    local_a0 = 0;
    local_98 = '\0';
  }
  else {
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,*(long *)(cVar6._M_node + 2),
               (long)&(cVar6._M_node[2]._M_parent)->_M_color + *(long *)(cVar6._M_node + 2));
  }
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"conference","");
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_01->_M_t,&local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_c8 = &local_b8;
  if (cVar6._M_node == p_Var16) {
    local_c0 = 0;
    local_b8 = '\0';
  }
  else {
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,*(long *)(cVar6._M_node + 2),
               (long)&(cVar6._M_node[2]._M_parent)->_M_color + *(long *)(cVar6._M_node + 2));
  }
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"tags","");
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_01->_M_t,&local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_118 = local_108;
  if (cVar6._M_node == p_Var16) {
    local_110 = 0;
    local_108[0]._M_data._0_1_ = 0;
LAB_001349cd:
    local_138.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_138.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_138.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_118,*(long *)(cVar6._M_node + 2),
               (long)&(cVar6._M_node[2]._M_parent)->_M_color + *(long *)(cVar6._M_node + 2));
    prVar12 = local_118;
    if (local_110 == 0) goto LAB_001349cd;
    pcVar15 = (char *)((long)&local_118->_M_data + local_110);
    local_138.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_138.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_138.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_158._M_dataplus._M_p._0_1_ = 0x2c;
    local_70 = this_01;
    local_68 = p_Var16;
    pcVar7 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                       (local_118,pcVar15);
    local_60 = this;
    if (pcVar7 != pcVar15) {
      do {
        local_f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(pcVar7 + -(long)prVar12);
        local_158._M_dataplus._M_p = (pointer)prVar12;
        std::
        vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::emplace_back<char_const*,long>
                  ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                    *)&local_138,(char **)&local_158,(long *)&local_f8);
        prVar12 = (reference_wrapper<const_cppti::TalksDB::TalkRef> *)(pcVar7 + 1);
        local_158._M_dataplus._M_p._0_1_ = 0x2c;
        pcVar7 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                           (prVar12,pcVar15,&local_158);
      } while (pcVar7 != pcVar15);
    }
    local_f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(pcVar15 + -(long)prVar12);
    local_158._M_dataplus._M_p = (pointer)prVar12;
    std::
    vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
    ::emplace_back<char_const*,long>
              ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                *)&local_138,(char **)&local_158,(long *)&local_f8);
    this_01 = local_70;
    this = local_60;
    p_Var16 = local_68;
  }
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"year","");
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_01->_M_t,&local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_f8 = &local_e8;
  if (cVar6._M_node == p_Var16) {
    local_f0 = 0;
    local_e8._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,*(long *)(cVar6._M_node + 2),
               (long)&(cVar6._M_node[2]._M_parent)->_M_color + *(long *)(cVar6._M_node + 2));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"speaker=\'",9);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_a8,local_a0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\', conference=\'",0xf);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_c8,local_c0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\', tags=\'",9);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_118,local_110);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\', year=",8);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,local_f8->_M_local_buf,local_f0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  __nptr = local_f8;
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_f8->_M_local_buf + local_f0);
  paVar11 = local_f8;
  if (0 < (long)local_f0 >> 2) {
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((long)local_f8 + (local_f0 & 0xfffffffffffffffc));
    lVar14 = ((long)local_f0 >> 2) + 1;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((long)local_f8 + 3);
    do {
      if ((int)*(char *)((long)(&paVar13->_M_allocated_capacity + -1) + 5) - 0x3aU < 0xfffffff6) {
        paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)(&paVar13->_M_allocated_capacity + -1) + 5);
        goto LAB_00134c1a;
      }
      if ((int)*(char *)((long)(&paVar13->_M_allocated_capacity + -1) + 6) - 0x3aU < 0xfffffff6) {
        paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)(&paVar13->_M_allocated_capacity + -1) + 6);
        goto LAB_00134c1a;
      }
      if ((int)*(char *)((long)(&paVar13->_M_allocated_capacity + -1) + 7) - 0x3aU < 0xfffffff6) {
        paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)(&paVar13->_M_allocated_capacity + -1) + 7);
        goto LAB_00134c1a;
      }
      if ((int)paVar13->_M_local_buf[0] - 0x3aU < 0xfffffff6) goto LAB_00134c1a;
      lVar14 = lVar14 + -1;
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)paVar13 + 4);
    } while (1 < lVar14);
  }
  lVar14 = (long)paVar1 - (long)paVar11;
  if (lVar14 == 1) {
LAB_00134bf9:
    paVar13 = paVar11;
    if (0xfffffff5 < (int)paVar11->_M_local_buf[0] - 0x3aU) {
      paVar13 = paVar1;
    }
LAB_00134c1a:
    if (paVar13 != paVar1) goto LAB_00134e16;
  }
  else {
    if (lVar14 == 2) {
LAB_00134beb:
      paVar13 = paVar11;
      if (0xfffffff5 < (int)paVar11->_M_local_buf[0] - 0x3aU) {
        paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)paVar11 + 1);
        goto LAB_00134bf9;
      }
      goto LAB_00134c1a;
    }
    if (lVar14 == 3) {
      paVar13 = paVar11;
      if (0xfffffff5 < (int)paVar11->_M_local_buf[0] - 0x3aU) {
        paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)paVar11 + 1);
        goto LAB_00134beb;
      }
      goto LAB_00134c1a;
    }
  }
  if (local_f0 == 0) {
    lVar14 = 0;
  }
  else {
    piVar9 = __errno_location();
    iVar2 = *piVar9;
    *piVar9 = 0;
    lVar14 = strtol(__nptr->_M_local_buf,(char **)&local_158,10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p == __nptr) {
      std::__throw_invalid_argument("stoi");
LAB_00134ec4:
      uVar10 = std::__throw_out_of_range("stoi");
      if (local_138.
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_138.
                        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_138.
                              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_138.
                              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_118 != local_108) {
        operator_delete(local_118,
                        CONCAT71(local_108[0]._M_data._1_7_,local_108[0]._M_data._0_1_) + 1);
      }
      if (local_c8 != &local_b8) {
        operator_delete(local_c8,CONCAT71(uStack_b7,local_b8) + 1);
      }
      if (local_a8 != &local_98) {
        operator_delete(local_a8,CONCAT71(uStack_97,local_98) + 1);
      }
      _Unwind_Resume(uVar10);
    }
    if (((int)lVar14 != lVar14) || (*piVar9 == 0x22)) goto LAB_00134ec4;
    if (*piVar9 == 0) {
      *piVar9 = iVar2;
    }
  }
  sVar4 = local_a0;
  pcVar15 = local_a8;
  sVar3 = local_c0;
  pcVar7 = local_c8;
  this_00 = (this->talksdb)._M_data;
  gsl::span<std::basic_string_view<char,std::char_traits<char>>const,-1l>::
  span<std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>,void>
            ((span<std::basic_string_view<char,std::char_traits<char>>const,_1l> *)&local_48,
             &local_138);
  filtertags.storage_.data_ = peStack_40;
  filtertags.storage_.super_extent_type<_1L>.size_ = local_48.size_;
  speaker_00._M_str = pcVar15;
  speaker_00._M_len = sVar4;
  conference_00._M_str = pcVar7;
  conference_00._M_len = sVar3;
  TalksDB::get(&local_88,this_00,speaker_00,conference_00,filtertags,lVar14,0x32);
  local_d0.object = (object_t *)0x0;
  local_d8[0] = array;
  local_158._M_dataplus._M_p =
       (pointer)local_88.
                super__Vector_base<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_50._M_current =
       local_88.
       super__Vector_base<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_d0.object =
       (object_t *)
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
       ::
       create<std::vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,__gnu_cxx::__normal_iterator<std::reference_wrapper<cppti::TalksDB::TalkRef_const>const*,std::vector<std::reference_wrapper<cppti::TalksDB::TalkRef_const>,std::allocator<std::reference_wrapper<cppti::TalksDB::TalkRef_const>>>>,__gnu_cxx::__normal_iterator<std::reference_wrapper<cppti::TalksDB::TalkRef_const>const*,std::vector<std::reference_wrapper<cppti::TalksDB::TalkRef_const>,std::allocator<std::reference_wrapper<cppti::TalksDB::TalkRef_const>>>>>
                 ((__normal_iterator<const_std::reference_wrapper<const_cppti::TalksDB::TalkRef>_*,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>
                   *)&local_158,&local_50);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_d8);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_d8);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::dump(&local_158,
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          *)local_d8,-1,' ',false,strict);
  pRVar5 = local_58;
  std::__cxx11::string::_M_assign((string *)&local_58->body);
  local_50._M_current = (reference_wrapper<const_cppti::TalksDB::TalkRef> *)0x165c2b;
  local_38 = "application/json";
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_equal<char_const*&,char_const*&>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&pRVar5->headers,(char **)&local_50,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_d8);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_d8 + 8),local_d8[0]);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.
         super__Vector_base<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_88.
                    super__Vector_base<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
LAB_00134e16:
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,CONCAT71(local_e8._M_allocated_capacity._1_7_,local_e8._M_local_buf[0])
                             + 1);
  }
  if (local_138.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.
                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_138.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_118 != local_108) {
    operator_delete(local_118,CONCAT71(local_108[0]._M_data._1_7_,local_108[0]._M_data._0_1_) + 1);
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,CONCAT71(uStack_b7,local_b8) + 1);
  }
  if (local_a8 != &local_98) {
    operator_delete(local_a8,CONCAT71(uStack_97,local_98) + 1);
  }
  return;
}

Assistant:

void HTTPController::routeTalks(Request const& req, Response& res)
{
  auto const speaker = req.get_param_value("speaker");
  auto const conference = req.get_param_value("conference");
  auto const raw_tags = req.get_param_value("tags");
  auto const tags = splitTags(raw_tags);
  auto const rawyear = req.get_param_value("year");
  std::cout << "speaker='" << speaker << "', conference='" << conference
            << "', tags='" << raw_tags << "', year=" << rawyear << std::endl;
  if (!std::all_of(rawyear.begin(), rawyear.end(), [&](char c) {
        return std::isdigit(c);
      }))
    return;
  auto const year = rawyear.empty() ? 0 : std::stoi(rawyear);
  auto const& talks = this->talksdb.get().get(speaker, conference, tags, year);

  nlohmann::json const json = talks;
  res.set_content(json.dump(), "application/json");
}